

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O0

bool __thiscall
QPDF::isEncrypted(QPDF *this,int *R,int *P,int *V,encryption_method_e *stream_method,
                 encryption_method_e *string_method,encryption_method_e *file_method)

{
  int iVar1;
  pointer pMVar2;
  element_type *peVar3;
  longlong lVar4;
  bool bVar5;
  allocator<char> local_139;
  string local_138 [32];
  undefined1 local_118 [8];
  QPDFObjectHandle Vkey;
  string local_100 [32];
  undefined1 local_e0 [8];
  QPDFObjectHandle Rkey;
  string local_c8 [32];
  undefined1 local_a8 [8];
  QPDFObjectHandle Pkey;
  allocator<char> local_81;
  string local_80 [32];
  undefined1 local_60 [8];
  QPDFObjectHandle encrypt;
  QPDFObjectHandle trailer;
  encryption_method_e *string_method_local;
  encryption_method_e *stream_method_local;
  int *V_local;
  int *P_local;
  int *R_local;
  QPDF *this_local;
  
  pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  peVar3 = std::
           __shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&pMVar2->encp);
  bVar5 = (peVar3->encrypted & 1U) != 0;
  if (bVar5) {
    getTrailer((QPDF *)&encrypt.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_80,"/Encrypt",&local_81);
    QPDFObjectHandle::getKey
              ((QPDFObjectHandle *)local_60,
               (string *)
               &encrypt.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator(&local_81);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_c8,"/P",
               (allocator<char> *)
               ((long)&Rkey.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               + 7));
    QPDFObjectHandle::getKey((QPDFObjectHandle *)local_a8,(string *)local_60);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&Rkey.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               + 7));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_100,"/R",
               (allocator<char> *)
               ((long)&Vkey.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               + 7));
    QPDFObjectHandle::getKey((QPDFObjectHandle *)local_e0,(string *)local_60);
    std::__cxx11::string::~string(local_100);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&Vkey.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               + 7));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_138,"/V",&local_139);
    QPDFObjectHandle::getKey((QPDFObjectHandle *)local_118,(string *)local_60);
    std::__cxx11::string::~string(local_138);
    std::allocator<char>::~allocator(&local_139);
    lVar4 = QPDFObjectHandle::getIntValue((QPDFObjectHandle *)local_a8);
    *P = (int)lVar4;
    iVar1 = QPDFObjectHandle::getIntValueAsInt((QPDFObjectHandle *)local_e0);
    *R = iVar1;
    iVar1 = QPDFObjectHandle::getIntValueAsInt((QPDFObjectHandle *)local_118);
    *V = iVar1;
    pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    peVar3 = std::
             __shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&pMVar2->encp);
    *stream_method = peVar3->cf_stream;
    pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    peVar3 = std::
             __shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&pMVar2->encp);
    *string_method = peVar3->cf_string;
    pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    peVar3 = std::
             __shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&pMVar2->encp);
    *file_method = peVar3->cf_file;
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_118);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_e0);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_a8);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_60);
    QPDFObjectHandle::~QPDFObjectHandle
              ((QPDFObjectHandle *)
               &encrypt.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  return bVar5;
}

Assistant:

bool
QPDF::isEncrypted(
    int& R,
    int& P,
    int& V,
    encryption_method_e& stream_method,
    encryption_method_e& string_method,
    encryption_method_e& file_method)
{
    if (m->encp->encrypted) {
        QPDFObjectHandle trailer = getTrailer();
        QPDFObjectHandle encrypt = trailer.getKey("/Encrypt");
        QPDFObjectHandle Pkey = encrypt.getKey("/P");
        QPDFObjectHandle Rkey = encrypt.getKey("/R");
        QPDFObjectHandle Vkey = encrypt.getKey("/V");
        P = static_cast<int>(Pkey.getIntValue());
        R = Rkey.getIntValueAsInt();
        V = Vkey.getIntValueAsInt();
        stream_method = m->encp->cf_stream;
        string_method = m->encp->cf_string;
        file_method = m->encp->cf_file;
        return true;
    } else {
        return false;
    }
}